

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
              (char **begin,char *end,
              specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
              *eh)

{
  bool bVar1;
  uint big;
  uint max_int;
  uint value;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  *eh_local;
  char *end_local;
  char **begin_local;
  
  if (((*begin == end) || (**begin < '0')) || ('9' < **begin)) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format.h"
                ,0x816,"");
  }
  big = 0;
  do {
    if (0xccccccc < big) {
      big = 0x80000000;
      break;
    }
    big = big * 10 + **begin + -0x30;
    *begin = *begin + 1;
    bVar1 = false;
    if ((*begin != end) && (bVar1 = false, '/' < **begin)) {
      bVar1 = **begin < ':';
    }
  } while (bVar1);
  if (0x7fffffff < big) {
    specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_error(&eh->
                super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ,"number is too big");
  }
  return big;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}